

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O2

void dmrC_cleanup_and_cse(dmr_C *C,entrypoint *ep)

{
  allocator *alloc;
  uint uVar1;
  int iVar2;
  basic_block *pbVar3;
  instruction *piVar4;
  undefined1 *puVar5;
  instruction *insn;
  instruction *piVar6;
  basic_block *pbVar7;
  basic_block *pbVar8;
  void *ptr;
  linearizer_state_t *plVar9;
  instruction *def;
  unsigned_long uVar10;
  undefined1 *puVar11;
  instruction_list **head;
  long lVar12;
  instruction_list **plist;
  ptr_list_iter local_a8;
  ptr_list_iter local_90;
  undefined1 local_78 [8];
  ptr_list_iter bbiter__;
  
  dmrC_simplify_memops(C,ep);
  alloc = &C->ptrlist_allocator;
  plVar9 = C->L;
  do {
    plVar9->repeat_phase = 0;
    ptrlist_forward_iterator((ptr_list_iter *)local_78,(ptr_list *)ep->bbs);
    while (pbVar3 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_78),
          pbVar3 != (basic_block *)0x0) {
      ptrlist_forward_iterator(&local_a8,(ptr_list *)pbVar3->insns);
switchD_0012819e_caseD_26:
      piVar4 = (instruction *)ptrlist_iter_next(&local_a8);
      if (piVar4 != (instruction *)0x0) {
        if (piVar4->bb != (basic_block *)0x0) {
          if (piVar4->bb != pbVar3) {
            __assert_fail("insn->bb == bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/cse.c"
                          ,0x28,
                          "void clean_up_one_instruction(struct dmr_C *, struct basic_block *, struct instruction *)"
                         );
          }
          uVar1 = dmrC_simplify_instruction(C,piVar4);
          plVar9 = C->L;
          plVar9->repeat_phase = plVar9->repeat_phase | uVar1;
          if (piVar4->bb != (basic_block *)0x0) {
            uVar1 = *(uint *)piVar4 & 0xff;
            if (uVar1 - 9 < 0x2b) {
              puVar11 = (undefined1 *)(ulong)((*(uint *)piVar4 >> 0xb) + uVar1 * 8);
              switch(uVar1) {
              case 0x25:
                puVar11 = (undefined1 *)
                          ((long)&((piVar4->field_6).field_6.src3)->nr + (long)puVar11);
              default:
                puVar11 = &(((piVar4->field_6).field_1.bb_false)->pos).field_0x0 + (long)puVar11;
              case 0x23:
              case 0x24:
              case 0x2c:
                puVar11 = &(((piVar4->field_6).field_1.bb_true)->pos).field_0x0 + (long)puVar11;
                break;
              case 0x26:
              case 0x27:
              case 0x28:
              case 0x29:
              case 0x2a:
              case 0x2d:
              case 0x2f:
              case 0x32:
                goto switchD_0012819e_caseD_26;
              case 0x2b:
                puVar11 = &(((piVar4->field_6).field_1.bb_false)->pos).field_0x0 + (long)puVar11;
                break;
              case 0x2e:
                ptrlist_forward_iterator(&local_90,(ptr_list *)(piVar4->field_6).field_1.bb_true);
                while (puVar5 = (undefined1 *)ptrlist_iter_next(&local_90),
                      puVar5 != (undefined1 *)0x0) {
                  if (((pseudo *)puVar5 != &C->L->void_pseudo) &&
                     (lVar12 = *(long *)(puVar5 + 0x20), lVar12 != 0)) {
                    puVar11 = puVar11 + *(long *)(lVar12 + 8) + *(long *)(lVar12 + 0x28);
                  }
                }
                plVar9 = C->L;
              }
              ptrlist_add((ptr_list **)
                          (plVar9->insn_hash_table +
                          (((uint)((ulong)puVar11 >> 0x10) & 0xffff) + (int)puVar11 & 0xff)),piVar4,
                          alloc);
            }
          }
        }
        goto switchD_0012819e_caseD_26;
      }
    }
    if ((C->L->repeat_phase & 3) != 0) {
      dmrC_kill_unreachable_bbs(C,ep);
    }
    for (lVar12 = 0; plVar9 = C->L, lVar12 != 0x100; lVar12 = lVar12 + 1) {
      if (plVar9->insn_hash_table[lVar12] != (instruction_list *)0x0) {
        plist = plVar9->insn_hash_table + lVar12;
        iVar2 = ptrlist_size((ptr_list *)plVar9->insn_hash_table[lVar12]);
        if (1 < iVar2) {
          bbiter__._16_8_ = lVar12;
          ptrlist_sort((ptr_list **)plist,C,insn_compare);
          ptrlist_forward_iterator((ptr_list_iter *)local_78,(ptr_list *)*plist);
          piVar4 = (instruction *)0x0;
LAB_001282a3:
          def = piVar4;
          insn = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_78);
          lVar12 = bbiter__._16_8_;
          if (insn != (instruction *)0x0) {
            piVar4 = def;
            if (((insn->bb != (basic_block *)0x0) && (piVar4 = insn, def != (instruction *)0x0)) &&
               (iVar2 = insn_compare(C,def,insn), iVar2 == 0)) {
              pbVar3 = def->bb;
              pbVar8 = insn->bb;
              if (pbVar3 == pbVar8) {
                ptrlist_forward_iterator(&local_90,(ptr_list *)pbVar3->insns);
                do {
                  piVar6 = (instruction *)ptrlist_iter_next(&local_90);
                  if (piVar6 == (instruction *)0x0) {
                    dmrC_warning(C,pbVar3->pos,"Whaa? unable to find CSE instructions");
                    piVar4 = def;
                    goto LAB_001282a3;
                  }
                  if (piVar6 == def) {
                    cse_one_instruction(C,insn,def);
                    piVar4 = def;
                    goto LAB_001282a3;
                  }
                } while (piVar6 != insn);
                cse_one_instruction(C,def,insn);
              }
              else {
                uVar10 = C->L->bb_generation + 1;
                C->L->bb_generation = uVar10;
                iVar2 = bb_dominates(ep,pbVar3,pbVar8,uVar10);
                if (iVar2 == 0) {
                  uVar10 = C->L->bb_generation + 1;
                  C->L->bb_generation = uVar10;
                  iVar2 = bb_dominates(ep,pbVar8,pbVar3,uVar10);
                  if (iVar2 == 0) {
                    iVar2 = ptrlist_size((ptr_list *)pbVar3->parents);
                    piVar4 = def;
                    if (iVar2 == 1) {
                      pbVar7 = (basic_block *)ptrlist_first((ptr_list *)pbVar3->parents);
                      iVar2 = ptrlist_size((ptr_list *)pbVar8->parents);
                      if (((iVar2 == 1) &&
                          (pbVar8 = (basic_block *)ptrlist_first((ptr_list *)pbVar8->parents),
                          pbVar7 != (basic_block *)0x0)) && (pbVar8 == pbVar7)) {
                        cse_one_instruction(C,insn,def);
                        ptrlist_remove((ptr_list **)&pbVar3->insns,def,1);
                        head = &pbVar7->insns;
                        ptr = ptrlist_undo_last((ptr_list **)head);
                        def->bb = pbVar7;
                        ptrlist_add((ptr_list **)head,def,alloc);
                        ptrlist_add((ptr_list **)head,ptr,alloc);
                      }
                    }
                  }
                  else {
                    cse_one_instruction(C,def,insn);
                  }
                }
                else {
                  cse_one_instruction(C,insn,def);
                  piVar4 = def;
                }
              }
            }
            goto LAB_001282a3;
          }
        }
        ptrlist_remove_all((ptr_list **)plist);
      }
    }
    uVar1 = plVar9->repeat_phase;
    if ((uVar1 & 2) != 0) {
      dmrC_simplify_memops(C,ep);
      plVar9 = C->L;
      uVar1 = plVar9->repeat_phase;
    }
    if ((uVar1 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void dmrC_cleanup_and_cse(struct dmr_C *C, struct entrypoint *ep)
{
	int i;

	dmrC_simplify_memops(C, ep);
repeat:
	C->L->repeat_phase = 0;
	clean_up_insns(C, ep);
	if (C->L->repeat_phase & REPEAT_CFG_CLEANUP)
		dmrC_kill_unreachable_bbs(C, ep);
	for (i = 0; i < INSN_HASH_SIZE; i++) {
		struct instruction_list **list = C->L->insn_hash_table + i;
		if (*list) {
			if (dmrC_instruction_list_size(*list) > 1) {
				struct instruction *insn, *last;

				sort_instruction_list(C, list);

				last = NULL;
				FOR_EACH_PTR(*list, insn) {
					if (!insn->bb)
						continue;
					if (last) {
						if (!insn_compare(C, last, insn))
							insn = try_to_cse(C, ep, last, insn);
					}
					last = insn;
				} END_FOR_EACH_PTR(insn);
			}
			ptrlist_remove_all((struct ptr_list **)list);
		}
	}

	if (C->L->repeat_phase & REPEAT_SYMBOL_CLEANUP)
		dmrC_simplify_memops(C, ep);

	if (C->L->repeat_phase & REPEAT_CSE)
		goto repeat;
}